

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftzopen.c
# Opt level: O2

FT_Int32 ft_lzwstate_get_code(FT_LzwState state)

{
  FT_ULong FVar1;
  ulong uVar2;
  FT_Byte *pFVar3;
  FT_UInt FVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  FT_UInt FVar8;
  uint uVar9;
  
  FVar8 = state->num_bits;
  if (((state->buf_clear != '\0') || (uVar7 = state->buf_offset, state->buf_size <= uVar7)) ||
     (state->free_bits <= state->free_ent)) {
    if (state->free_bits <= state->free_ent) {
      FVar8 = FVar8 + 1;
      state->num_bits = FVar8;
      if (0x10 < FVar8) {
        return -1;
      }
      if (FVar8 < state->max_bits) {
        FVar4 = (int)(1L << ((byte)FVar8 & 0x3f)) - 0x100;
      }
      else {
        FVar4 = state->max_free + 1;
      }
      state->free_bits = FVar4;
    }
    if (state->buf_clear != '\0') {
      state->num_bits = 9;
      state->free_bits = 0x100;
      state->buf_clear = '\0';
      FVar8 = 9;
    }
    if (state->in_eof != 0) {
      return -1;
    }
    FVar1 = FT_Stream_TryRead(state->source,state->buf_tab,(ulong)FVar8);
    state->buf_total = state->buf_total + FVar1;
    uVar7 = state->num_bits;
    state->in_eof = (uint)(FVar1 < uVar7);
    state->buf_offset = 0;
    uVar5 = (int)FVar1 * 8;
    state->buf_size = uVar5;
    if (uVar5 <= uVar7) {
      return -1;
    }
    state->buf_size = (uVar5 | 1) - uVar7;
    uVar7 = 0;
    if (FVar1 == 0) {
      return -1;
    }
  }
  state->buf_offset = uVar7 + FVar8;
  uVar2 = (ulong)(uVar7 >> 3);
  uVar7 = uVar7 & 7;
  uVar5 = (uint)(state->buf_tab[uVar2] >> (sbyte)uVar7);
  iVar6 = 8 - uVar7;
  uVar9 = FVar8 - iVar6;
  if (uVar9 < 8) {
    pFVar3 = state->buf_tab + uVar2 + 1;
  }
  else {
    pFVar3 = state->buf_tab + uVar2 + 2;
    uVar5 = uVar5 | (uint)state->buf_tab[uVar2 + 1] << ((byte)iVar6 & 0x1f);
    iVar6 = 0x10 - uVar7;
    uVar9 = uVar9 - 8;
  }
  if (uVar9 != 0) {
    uVar5 = uVar5 | (~(-1 << ((byte)uVar9 & 0x1f)) & (uint)*pFVar3) << ((byte)iVar6 & 0x1f);
  }
  return uVar5;
}

Assistant:

static FT_Int32
  ft_lzwstate_get_code( FT_LzwState  state )
  {
    FT_UInt   num_bits = state->num_bits;
    FT_UInt   offset   = state->buf_offset;
    FT_Byte*  p;
    FT_Int    result;


    if ( state->buf_clear                    ||
         offset >= state->buf_size           ||
         state->free_ent >= state->free_bits )
    {
      if ( state->free_ent >= state->free_bits )
      {
        state->num_bits = ++num_bits;
        if ( num_bits > LZW_MAX_BITS )
          return -1;

        state->free_bits = state->num_bits < state->max_bits
                           ? (FT_UInt)( ( 1UL << num_bits ) - 256 )
                           : state->max_free + 1;
      }

      if ( state->buf_clear )
      {
        state->num_bits  = num_bits = LZW_INIT_BITS;
        state->free_bits = (FT_UInt)( ( 1UL << num_bits ) - 256 );
        state->buf_clear = 0;
      }

      if ( ft_lzwstate_refill( state ) < 0 )
        return -1;

      offset = 0;
    }

    state->buf_offset = offset + num_bits;

    p         = &state->buf_tab[offset >> 3];
    offset   &= 7;
    result    = *p++ >> offset;
    offset    = 8 - offset;
    num_bits -= offset;

    if ( num_bits >= 8 )
    {
      result   |= *p++ << offset;
      offset   += 8;
      num_bits -= 8;
    }
    if ( num_bits > 0 )
      result |= ( *p & LZW_MASK( num_bits ) ) << offset;

    return result;
  }